

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O2

void nn_rw_loop(nn_options_t *options,int sock)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  int *piVar5;
  int millis;
  long lVar6;
  long lVar7;
  void *buf;
  long local_38;
  
  local_38 = (long)(int)(options->send_interval * 1000.0);
  iVar1 = (int)(options->recv_timeout * 1000.0);
LAB_00103af4:
  uVar4 = nn_clock_ms();
  uVar2 = nn_send(sock,(options->data_to_send).data,(long)(options->data_to_send).length,0);
  if ((int)uVar2 < 0) {
    piVar5 = __errno_location();
    if (*piVar5 == 0xb) {
      fwrite("Message not sent (EAGAIN)\n",0x1a,1,_stderr);
      goto LAB_00103b38;
    }
  }
  nn_assert_errno(~uVar2 >> 0x1f,"Can\'t send");
LAB_00103b38:
  if (options->send_interval <= 0.0 && options->send_interval != 0.0) {
    nn_recv_loop(options,sock);
    return;
  }
  lVar7 = uVar4 + local_38;
LAB_00103b4a:
  uVar4 = nn_clock_ms();
  lVar6 = lVar7 - uVar4;
  if (0 < lVar6) {
    iVar3 = iVar1;
    if (lVar6 < iVar1) {
      iVar3 = (int)lVar6;
    }
    millis = (int)lVar6;
    if (-1 < iVar1) {
      millis = iVar3;
    }
    nn_set_recv_timeout(sock,millis);
    uVar2 = nn_recv(sock,&buf,0xffffffffffffffff);
    if ((int)uVar2 < 0) goto LAB_00103bb9;
    goto LAB_00103b89;
  }
  goto LAB_00103af4;
LAB_00103bb9:
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  if (iVar3 != 0xb) {
    if ((iVar3 == 0x9523dfe) || (iVar3 == 0x6e)) {
      uVar4 = nn_clock_ms();
      lVar6 = lVar7 - uVar4;
      if (0 < lVar6) {
        nn_sleep((int)lVar6);
      }
    }
    else {
LAB_00103b89:
      nn_assert_errno(~uVar2 >> 0x1f,"Can\'t recv");
      nn_print_message(options,(char *)buf,uVar2);
      nn_freemsg(buf);
    }
  }
  goto LAB_00103b4a;
}

Assistant:

void nn_rw_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;
    uint64_t start_time;
    int64_t time_to_sleep, interval, recv_timeout;

    interval = (int)(options->send_interval*1000);
    recv_timeout = (int)(options->recv_timeout*1000);

    for (;;) {
        start_time = nn_clock_ms();
        rc = nn_send (sock,
            options->data_to_send.data, options->data_to_send.length,
            0);
        if (rc < 0 && errno == EAGAIN) {
            fprintf (stderr, "Message not sent (EAGAIN)\n");
        } else {
            nn_assert_errno (rc >= 0, "Can't send");
        }
        if (options->send_interval < 0) {  /*  Never send any more  */
            nn_recv_loop (options, sock);
            return;
        }

        for (;;) {
            time_to_sleep = (start_time + interval) - nn_clock_ms();
            if (time_to_sleep <= 0) {
                break;
            }
            if (recv_timeout >= 0 && time_to_sleep > recv_timeout)
            {
                time_to_sleep = recv_timeout;
            }
            nn_set_recv_timeout (sock, (int) time_to_sleep);
            rc = nn_recv (sock, &buf, NN_MSG, 0);
            if (rc < 0) {
                if (errno == EAGAIN) {
                    continue;
                } else if (errno == ETIMEDOUT || errno == EFSM) {
                    time_to_sleep = (start_time + interval) - nn_clock_ms();
                    if (time_to_sleep > 0)
                        nn_sleep ((int) time_to_sleep);
                    continue;
                }
            }
            nn_assert_errno (rc >= 0, "Can't recv");
            nn_print_message (options, buf, rc);
            nn_freemsg (buf);
        }
    }
}